

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O2

int __thiscall Fl_Menu_Item::size(Fl_Menu_Item *this)

{
  long lVar1;
  int iVar2;
  Fl_Menu_Item *m;
  
  lVar1 = 0;
  iVar2 = 0;
  do {
    if (*(long *)((long)&this->text + lVar1) == 0) {
      if (iVar2 == 0) {
        return (int)(lVar1 / 0x38) + 1;
      }
      iVar2 = iVar2 + -1;
    }
    else {
      iVar2 = iVar2 + (uint)((*(uint *)((long)&this->flags + lVar1) >> 6 & 1) != 0);
    }
    lVar1 = lVar1 + 0x38;
  } while( true );
}

Assistant:

int Fl_Menu_Item::size() const {
  const Fl_Menu_Item* m = this;
  int nest = 0;
  for (;;) {
    if (!m->text) {
      if (!nest) return (int) (m-this+1);
      nest--;
    } else if (m->flags & FL_SUBMENU) {
      nest++;
    }
    m++;
  }
}